

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

int SMCompatible_Band(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  uint uVar2;
  
  SVar1 = SUNMatGetID(A);
  uVar2 = 0;
  if (SVar1 == SUNMATRIX_BAND) {
    SVar1 = SUNMatGetID(B);
    if (SVar1 == SUNMATRIX_BAND) {
      if (*A->content == *B->content) {
        uVar2 = (uint)(*(long *)((long)A->content + 8) == *(long *)((long)B->content + 8));
      }
    }
  }
  return uVar2;
}

Assistant:

static booleantype SMCompatible_Band(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be SUNMATRIX_BAND */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return SUNFALSE;
  if (SUNMatGetID(B) != SUNMATRIX_BAND)
    return SUNFALSE;

  /* both matrices must have the same number of columns
     (note that we do not check for identical bandwidth) */
  if (SM_ROWS_B(A) != SM_ROWS_B(B))
    return SUNFALSE;
  if (SM_COLUMNS_B(A) != SM_COLUMNS_B(B))
    return SUNFALSE;

  return SUNTRUE;
}